

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O0

void inputParticle(Particle *particle,int filenum,char *seq)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  int local_358;
  int local_354;
  int j_1;
  int j;
  int k;
  int cntLines;
  char buffer [256];
  char *filename;
  char *fileAddress;
  ifstream inFile;
  char *seq_local;
  int filenum_local;
  Particle *particle_local;
  
  std::ifstream::ifstream(&fileAddress);
  pcVar6 = catStrStr(inputAddress,"particleO_");
  pcVar6 = catStrIntStr(pcVar6,filenum + 1,".txt");
  openFile(pcVar6,(ifstream *)&fileAddress);
  j = 0;
  while( true ) {
    bVar4 = std::ios::eof();
    if (((bVar4 ^ 0xff) & 1) == 0) break;
    std::istream::getline((char *)&fileAddress,(long)&k);
    j = j + 1;
  }
  iVar5 = j + -1;
  iVar9 = iVar5;
  if (iVar5 < 0) {
    iVar9 = j + 2;
  }
  particle->numAA = iVar9 >> 2;
  particle->numAtom = particle->numAA * 3;
  std::ifstream::close();
  openFile(pcVar6,(ifstream *)&fileAddress);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(iVar5 * 3);
  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar7);
  particle->addO_origin = pdVar8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(particle->numAA * 9);
  uVar7 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar7);
  particle->origin = pdVar8;
  j_1 = 0;
  for (local_354 = 0;
      SBORROW4(local_354,particle->numAA * 0xc) != local_354 + particle->numAA * -0xc < 0;
      local_354 = local_354 + 1) {
    std::istream::operator>>((istream *)&fileAddress,particle->addO_origin + local_354);
    if (local_354 % 0xc < 9) {
      particle->origin[j_1] = particle->addO_origin[local_354];
      j_1 = j_1 + 1;
    }
  }
  particle->sizeOfAddO_origin = particle->numAA * 0xc;
  particle->sizeOfOrigin = particle->numAA * 9;
  std::ifstream::close();
  if (pcVar6 != (char *)0x0) {
    operator_delete(pcVar6);
  }
  pcVar6 = catStrStr(inputAddress,"phi");
  pcVar6 = catStrIntStr(pcVar6,filenum + 1,".txt");
  openFile(pcVar6,(ifstream *)&fileAddress);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(particle->numAA * 3 + -3);
  uVar7 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar7);
  particle->Position = pdVar8;
  for (local_358 = 0; local_358 < particle->numAA * 3 + -5; local_358 = local_358 + 3) {
    std::istream::operator>>((istream *)&fileAddress,particle->Position + local_358);
    particle->Position[(long)local_358 + 1] = 180.0;
    std::istream::operator>>((istream *)&fileAddress,particle->Position + (long)local_358 + 2);
  }
  std::ifstream::close();
  particle->sizeOfPosition = particle->numAA * 3 + -3;
  uVar7 = SUB168(ZEXT816(1) * ZEXT816(8),0);
  if (SUB168(ZEXT816(1) * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar7);
  particle->Cost = pdVar8;
  particle->index = filenum;
  particle->seq = seq;
  std::ifstream::~ifstream(&fileAddress);
  return;
}

Assistant:

void inputParticle(Particle &particle, int filenum, char *seq){
    ifstream inFile;
    char *fileAddress;
    char *filename;
    fileAddress = catStrStr(inputAddress, "particleO_");
    filename = catStrIntStr(fileAddress, filenum+1, ".txt");
    openFile(filename, inFile);
    char buffer[256];
    // get the number of lines of the input file
    int cntLines = 0;
    while (! inFile.eof()) { inFile.getline(buffer, 256); cntLines++; }
    cntLines--;
    particle.numAA = cntLines/4;                                            // the number of AA
    particle.numAtom = particle.numAA *3;                          // the number of atoms ( not add O)
    inFile.close();                                                                         //get how many lines the input has

    // read the file to get the coordinaries
    openFile(filename, inFile);
    particle.addO_origin = new double[3*cntLines];                  //  the x,y,z of every atoms in the particle
    particle.origin = new double[particle.numAA*3 *3];          //  x,y,z, delete the number of the atom O
    int k=0;
    //  read the file by lines
    for (int j=0; j<12 * particle.numAA; j++){
        inFile >> particle.addO_origin[j];
        if (j % 12<9)
            particle.origin[k++] = particle.addO_origin[j];
    }
    particle.sizeOfAddO_origin = particle.numAA*4*3;
    particle.sizeOfOrigin = particle.numAA*3*3;                 //  the totally number of coordinaries
    inFile.close();
    delete filename;

    //  read the init angles
    fileAddress = catStrStr(inputAddress, "phi");
    filename = catStrIntStr(fileAddress, filenum+1, ".txt");
    openFile(filename, inFile);
    particle.Position = new double[3 * particle.numAA-3];     //   why so many 180  ?

    for (int j=0; j< 3*particle.numAA-5; j+=3){          // last : j=3*numAA-6; j+2=3*numAA-4
        inFile >> particle.Position[j] ;
        particle.Position[j+1] = 180;
        inFile >> particle.Position[j+2] ;
    }

    inFile.close();
    particle.sizeOfPosition = 3*particle.numAA-3;

    //  init particle.cost[]
    particle.Cost = new double [numObjective];

    particle.index = filenum;
    particle.seq = seq;

}